

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O3

void __thiscall Imf_3_4::Context::Context(Context *this,char *filename,undefined8 ctxtinit)

{
  int iVar1;
  ostream *poVar2;
  ArgExc *this_00;
  InputExc *this_01;
  stringstream _iex_throw_s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  Context(this);
  iVar1 = exr_start_read((this->_ctxt).
                         super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,filename,ctxtinit);
  if (iVar1 == 0) {
    return;
  }
  if (iVar1 == 0xd) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"Invalid or missing attribute when attempting to open \'",0x36);
    poVar2 = std::operator<<(local_190,filename);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' for read",10);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1a0);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Unable to open \'",0x10);
  poVar2 = std::operator<<(local_190,filename);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' for read",10);
  this_01 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_01,local_1a0);
  __cxa_throw(this_01,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

Context::Context (const char* filename, const ContextInitializer& ctxtinit, read_mode_t)
    : Context()
{
    exr_result_t rv;

    rv = exr_start_read (_ctxt.get (), filename, &(ctxtinit._initializer));
    if (EXR_ERR_SUCCESS != rv)
    {
        if (rv == EXR_ERR_MISSING_REQ_ATTR)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Invalid or missing attribute when attempting to open '"
                << filename << "' for read");
        }
        else
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Unable to open '" << filename << "' for read");
        }
    }
}